

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

Value * __thiscall
GlobOpt::OptDst(GlobOpt *this,Instr **pInstr,Value *dstVal,Value *src1Val,Value *src2Val,
               Value *dstIndirIndexVal,Value *src1IndirIndexVal)

{
  RegionType RVar1;
  OpCode OVar2;
  SymOpnd *this_00;
  code *pcVar3;
  OpndKind OVar4;
  bool bVar5;
  BOOLEAN BVar6;
  BailOutKind BVar7;
  undefined4 *puVar8;
  PropertySymOpnd *opnd;
  RegOpnd *pRVar9;
  StackSym *pSVar10;
  RegOpnd *this_01;
  GlobOpt *this_02;
  Value *pVVar11;
  Instr *pIVar12;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  Region *pRVar13;
  Opnd *this_03;
  BailOutKind bailOutKind;
  long lVar14;
  GlobOpt *this_04;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_4a;
  Value *pVStack_48;
  ValueType baseValueType;
  undefined7 extraout_var_02;
  
  this_00 = (SymOpnd *)(*pInstr)->m_dst;
  pVStack_48 = dstVal;
  if (this_00 == (SymOpnd *)0x0) {
    ProcessKills(this,*pInstr);
    goto LAB_00452cb0;
  }
  OVar4 = IR::Opnd::GetKind((Opnd *)this_00);
  if (OVar4 == OpndKindSym) {
    OVar4 = IR::Opnd::GetKind((Opnd *)this_00);
    if (OVar4 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar5) goto LAB_00452dec;
      *puVar8 = 0;
    }
    bVar5 = IR::SymOpnd::IsPropertySymOpnd(this_00);
    if (bVar5) {
      pIVar12 = *pInstr;
      opnd = IR::Opnd::AsPropertySymOpnd((Opnd *)this_00);
      FinishOptPropOp(this,pIVar12,opnd,(BasicBlock *)0x0,false,(bool *)0x0,(bool *)0x0);
    }
  }
  OVar4 = IR::Opnd::GetKind((Opnd *)this_00);
  if ((OVar4 == OpndKindIndir) && (this->prePassLoop == (Loop *)0x0)) {
    OVar4 = IR::Opnd::GetKind((Opnd *)this_00);
    if (OVar4 != OpndKindIndir) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
      if (!bVar5) goto LAB_00452dec;
      *puVar8 = 0;
    }
    local_4a = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)&this_00->m_sym->m_next;
    bVar5 = ValueType::IsLikelyNativeArray((ValueType *)&local_4a.field_0);
    if ((bVar5) && (pIVar12 = *pInstr, pIVar12->m_src1->m_type == TyVar)) {
      if (pIVar12->m_opcode == StElemC) {
        bVar5 = ValueType::IsLikelyNativeArray((ValueType *)&local_4a.field_0);
        if (!bVar5) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar8 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0xbf2,"(baseValueType.IsLikelyNativeArray())",
                             "baseValueType.IsLikelyNativeArray()");
          if (!bVar5) goto LAB_00452dec;
          *puVar8 = 0;
        }
        if (((*pInstr)->field_0x38 & 0x10) != 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar8 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0xbf3,"(!instr->HasBailOutInfo())","!instr->HasBailOutInfo()");
          if (!bVar5) goto LAB_00452dec;
          *puVar8 = 0;
        }
        GenerateBailAtOperation(this,pInstr,BailOutConventionalNativeArrayAccessOnly);
      }
      else if ((pIVar12->field_0x38 & 0x10) != 0) {
        BVar7 = IR::Instr::GetBailOutKind(pIVar12);
        bailOutKind = BVar7 - BailOutOnArrayAccessHelperCall;
        if ((BVar7 >> 0x11 & 1) == 0) {
          bailOutKind = BVar7;
        }
        if ((bailOutKind == BailOutInvalid) || (bailOutKind == BailOutOnImplicitCallsPreOp)) {
          IR::Instr::ClearBailOutInfo(*pInstr);
        }
        else {
          IR::Instr::SetBailOutKind(*pInstr,bailOutKind);
        }
      }
    }
  }
  ProcessKills(this,*pInstr);
  if (pVStack_48 == (Value *)0x0) {
    pVStack_48 = ValueNumberDst(this,pInstr,src1Val,src2Val);
  }
  if (this->prePassLoop == (Loop *)0x0) {
    if (((pVStack_48 != (Value *)0x0) &&
        (IR::Opnd::SetValueType
                   ((Opnd *)this_00,
                    (ValueType)
                    *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                     &(pVStack_48->valueInfo->super_ValueType).field_0.field_0),
        this->currentBlock->loop != (Loop *)0x0)) && (this->prePassLoop == (Loop *)0x0)) {
      OVar2 = (*pInstr)->m_opcode;
      if (((OVar2 == Ld_I4) || (OVar2 == Ld_A)) &&
         ((OVar4 = IR::Opnd::GetKind((*pInstr)->m_src1), OVar4 == OpndKindReg &&
          (bVar5 = Func::IsJitInDebugMode(this->func), !bVar5)))) {
        pRVar9 = IR::Opnd::AsRegOpnd((*pInstr)->m_src1);
        pSVar10 = pRVar9->m_sym;
        if (((pSVar10->field_0x1a & 1) != 0) &&
           (pSVar10 = StackSym::GetVarEquivSym(pSVar10,(Func *)0x0), pSVar10 == (StackSym *)0x0)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar8 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0xc3e,"(srcVarSym)","srcVarSym");
          if (!bVar5) goto LAB_00452dec;
          *puVar8 = 0;
          pSVar10 = (StackSym *)0x0;
        }
        if ((StackSym *)pVStack_48->valueInfo->symStore == pSVar10) {
          this_01 = IR::Opnd::AsRegOpnd((Opnd *)this_00);
          this_02 = (GlobOpt *)this_01->m_sym;
          if (((ulong)this_02->intConstantToValueMap & 0x10000) != 0) {
            lVar14 = 0;
            this_04 = this_02;
            this_02 = (GlobOpt *)StackSym::GetVarEquivSym((StackSym *)this_02,(Func *)0x0);
            if (this_02 == (GlobOpt *)0x0) {
              OptDst();
              RVar1 = this_04->currentRegion->type;
              pRVar13 = (Region *)(ulong)RVar1;
              if ((RVar1 == RegionTypeFinally) || (RVar1 == RegionTypeTry)) {
                OVar4 = IR::Opnd::GetKind(this_03);
                if (OVar4 != OpndKindReg) {
                  return (Value *)CONCAT71(extraout_var,OVar4);
                }
                OVar4 = IR::Opnd::GetKind(this_03);
                if (OVar4 != OpndKindReg) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
                  *puVar8 = 1;
                  bVar5 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                     ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
                  if (!bVar5) goto LAB_00452f92;
                  *puVar8 = 0;
                }
                if (((ulong)((Value *)this_03[1]._vptr_Opnd)[1].valueInfo & 0x2000) == 0) {
                  return (Value *)this_03[1]._vptr_Opnd;
                }
                OVar4 = IR::Opnd::GetKind(this_03);
                pVVar11 = (Value *)CONCAT71(extraout_var_00,OVar4);
                if (OVar4 != OpndKindReg) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
                  *puVar8 = 1;
                  bVar5 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                     ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
                  pVVar11 = (Value *)CONCAT71(extraout_var_01,bVar5);
                  if (!bVar5) {
LAB_00452f92:
                    pcVar3 = (code *)invalidInstructionException();
                    (*pcVar3)();
                  }
                  *puVar8 = 0;
                }
                if (((StackSym *)this_03[1]._vptr_Opnd)->m_type == TyVar) {
                  return pVVar11;
                }
                pSVar10 = StackSym::GetVarEquivSym((StackSym *)this_03[1]._vptr_Opnd,(Func *)0x0);
                if ((this_04->currentRegion->type == RegionTypeTry) &&
                   (BVar6 = BVSparse<Memory::JitArenaAllocator>::Test
                                      (this_04->currentRegion->writeThroughSymbolsSet,
                                       (pSVar10->super_Sym).m_id), BVar6 != '\0')) {
LAB_00452f54:
                  pRVar9 = IR::RegOpnd::New(pSVar10,TyVar,*(Func **)(lVar14 + 0x20));
                  pIVar12 = ToVar(this_04,*(Instr **)(lVar14 + 0x10),pRVar9,this_04->currentBlock,
                                  (Value *)0x0,false);
                  return (Value *)pIVar12;
                }
                pRVar13 = this_04->currentRegion;
                if (pRVar13->type == RegionTypeFinally) {
                  BVar6 = BVSparse<Memory::JitArenaAllocator>::Test
                                    (pRVar13->matchingTryRegion->writeThroughSymbolsSet,
                                     (pSVar10->super_Sym).m_id);
                  pRVar13 = (Region *)CONCAT71(extraout_var_02,BVar6);
                  if (BVar6 != '\0') goto LAB_00452f54;
                }
              }
              return (Value *)pRVar13;
            }
          }
          BVar6 = BVSparse<Memory::JitArenaAllocator>::Test
                            ((this->currentBlock->loop->regAlloc).liveOnBackEdgeSyms,
                             *(BVIndex *)&this_02->intConstantToStackSymMap);
          if ((BVar6 != '\0') &&
             (pVVar11 = GlobOptBlockData::FindValue
                                  (&this->currentBlock->globOptData,&pSVar10->super_Sym),
             pVVar11->valueNumber == pVStack_48->valueNumber)) {
            if (((pRVar9->super_Opnd).field_0xb & 4) == 0) {
              pIVar12 = IR::Instr::GetPrevRealInstrOrLabel(*pInstr);
              if (((pIVar12->m_dst == (Opnd *)0x0) ||
                  (bVar5 = IR::RegOpnd::IsEqualInternal(pRVar9,pIVar12->m_dst), !bVar5)) ||
                 (((pIVar12->m_src1 == (Opnd *)0x0 ||
                   (bVar5 = IR::Opnd::IsEqual(&this_01->super_Opnd,pIVar12->m_src1), !bVar5)) &&
                  ((pIVar12->m_src2 == (Opnd *)0x0 ||
                   (bVar5 = IR::Opnd::IsEqual(&this_01->super_Opnd,pIVar12->m_src2), !bVar5))))))
              goto LAB_00452c9d;
            }
            SetSymStoreDirect(this,pVStack_48->valueInfo,(Sym *)this_02);
          }
        }
      }
    }
  }
  else {
    OVar4 = IR::Opnd::GetKind((Opnd *)this_00);
    if (OVar4 == OpndKindReg) {
      OVar4 = IR::Opnd::GetKind((Opnd *)this_00);
      if (OVar4 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar5) {
LAB_00452dec:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar8 = 0;
      }
      BVSparse<Memory::JitArenaAllocator>::Set
                (this->rootLoopPrePass->symsDefInLoop,this_00->m_sym->m_id);
    }
  }
LAB_00452c9d:
  ValueNumberObjectType(this,(Opnd *)this_00,*pInstr);
LAB_00452cb0:
  pVVar11 = pVStack_48;
  CSEAddInstr(this,this->currentBlock,*pInstr,pVStack_48,src1Val,src2Val,dstIndirIndexVal,
              src1IndirIndexVal);
  return pVVar11;
}

Assistant:

Value*
GlobOpt::OptDst(
    IR::Instr ** pInstr,
    Value *dstVal,
    Value *src1Val,
    Value *src2Val,
    Value *dstIndirIndexVal,
    Value *src1IndirIndexVal)
{
    IR::Instr *&instr = *pInstr;
    IR::Opnd *opnd = instr->GetDst();

    if (opnd)
    {
        if (opnd->IsSymOpnd() && opnd->AsSymOpnd()->IsPropertySymOpnd())
        {
            this->FinishOptPropOp(instr, opnd->AsPropertySymOpnd());
        }

        if (opnd->IsIndirOpnd() && !this->IsLoopPrePass())
        {
            IR::RegOpnd *baseOpnd = opnd->AsIndirOpnd()->GetBaseOpnd();
            const ValueType baseValueType(baseOpnd->GetValueType());
            if ((
                    baseValueType.IsLikelyNativeArray() ||
                #ifdef _M_IX86
                    (
                        !AutoSystemInfo::Data.SSE2Available() &&
                        baseValueType.IsLikelyObject() &&
                        (
                            baseValueType.GetObjectType() == ObjectType::Float32Array ||
                            baseValueType.GetObjectType() == ObjectType::Float64Array
                        )
                    )
                #else
                    false
                #endif
                ) &&
                instr->GetSrc1()->IsVar())
            {
                if(instr->m_opcode == Js::OpCode::StElemC)
                {
                    // StElemC has different code that handles native array conversion or missing value stores. Add a bailout
                    // for those cases.
                    Assert(baseValueType.IsLikelyNativeArray());
                    Assert(!instr->HasBailOutInfo());
                    GenerateBailAtOperation(&instr, IR::BailOutConventionalNativeArrayAccessOnly);
                }
                else if(instr->HasBailOutInfo())
                {
                    // The lowerer is not going to generate a fast path for this case. Remove any bailouts that require the fast
                    // path. Note that the removed bailouts should not be necessary for correctness. Bailout on native array
                    // conversion will be handled automatically as normal.
                    IR::BailOutKind bailOutKind = instr->GetBailOutKind();
                    if(bailOutKind & IR::BailOutOnArrayAccessHelperCall)
                    {
                        bailOutKind -= IR::BailOutOnArrayAccessHelperCall;
                    }
                    if(bailOutKind == IR::BailOutOnImplicitCallsPreOp)
                    {
                        bailOutKind -= IR::BailOutOnImplicitCallsPreOp;
                    }
                    if(bailOutKind)
                    {
                        instr->SetBailOutKind(bailOutKind);
                    }
                    else
                    {
                        instr->ClearBailOutInfo();
                    }
                }
            }
        }
    }

    this->ProcessKills(instr);

    if (opnd)
    {
        if (dstVal == nullptr)
        {
            dstVal = ValueNumberDst(pInstr, src1Val, src2Val);
        }
        if (this->IsLoopPrePass())
        {
            // Keep track of symbols defined in the loop.
            if (opnd->IsRegOpnd())
            {
                StackSym *symDst = opnd->AsRegOpnd()->m_sym;
                rootLoopPrePass->symsDefInLoop->Set(symDst->m_id);
            }
        }
        else if (dstVal)
        {
            opnd->SetValueType(dstVal->GetValueInfo()->Type());
            if (currentBlock->loop &&
                !IsLoopPrePass() &&
                (instr->m_opcode == Js::OpCode::Ld_A || instr->m_opcode == Js::OpCode::Ld_I4) &&
                instr->GetSrc1()->IsRegOpnd() &&
                !func->IsJitInDebugMode())
            {
                // Look for the following patterns:
                //
                // Pattern 1:
                //     s1[liveOnBackEdge] = s3[dead]
                //
                // Pattern 2:
                //     s3 = operation(s1[liveOnBackEdge], s2)
                //     s1[liveOnBackEdge] = s3
                //
                // In both patterns, s1 and s3 have the same value by the end. Prefer to use s1 as the sym store instead of s3
                // since s1 is live on back-edge, as otherwise, their lifetimes overlap, requiring two registers to hold the
                // value instead of one.
                do
                {
                    IR::RegOpnd *const src = instr->GetSrc1()->AsRegOpnd();
                    StackSym *srcVarSym = src->m_sym;
                    if(srcVarSym->IsTypeSpec())
                    {
                        srcVarSym = srcVarSym->GetVarEquivSym(nullptr);
                        Assert(srcVarSym);
                    }
                    if(dstVal->GetValueInfo()->GetSymStore() != srcVarSym)
                    {
                        break;
                    }

                    IR::RegOpnd *const dst = opnd->AsRegOpnd();
                    StackSym *dstVarSym = dst->m_sym;
                    if(dstVarSym->IsTypeSpec())
                    {
                        dstVarSym = dstVarSym->GetVarEquivSym(nullptr);
                        Assert(dstVarSym);
                    }
                    if(!currentBlock->loop->regAlloc.liveOnBackEdgeSyms->Test(dstVarSym->m_id))
                    {
                        break;
                    }

                    Value *const srcValue = CurrentBlockData()->FindValue(srcVarSym);
                    if(srcValue->GetValueNumber() != dstVal->GetValueNumber())
                    {
                        break;
                    }

                    if(!src->GetIsDead())
                    {
                        IR::Instr *const prevInstr = instr->GetPrevRealInstrOrLabel();
                        IR::Opnd *const prevDst = prevInstr->GetDst();
                        if(!prevDst ||
                            !src->IsEqualInternal(prevDst) ||
                            !(
                                (prevInstr->GetSrc1() && dst->IsEqual(prevInstr->GetSrc1())) ||
                                (prevInstr->GetSrc2() && dst->IsEqual(prevInstr->GetSrc2()))
                            ))
                        {
                            break;
                        }
                    }

                    this->SetSymStoreDirect(dstVal->GetValueInfo(), dstVarSym);
                } while(false);
            }
        }

        this->ValueNumberObjectType(opnd, instr);
    }

    this->CSEAddInstr(this->currentBlock, *pInstr, dstVal, src1Val, src2Val, dstIndirIndexVal, src1IndirIndexVal);

    return dstVal;
}